

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks5.c
# Opt level: O1

ProxyNegotiator * proxy_socks5_new(ProxyNegotiatorVT *vt)

{
  void *__s;
  strbuf *psVar1;
  
  __s = safemalloc(1,0x1a0,0);
  memset(__s,0,0x1a0);
  *(ProxyNegotiatorVT **)((long)__s + 0x148) = vt;
  psVar1 = strbuf_new();
  *(strbuf **)((long)__s + 8) = psVar1;
  psVar1 = strbuf_new();
  *(strbuf **)((long)__s + 0x120) = psVar1;
  psVar1 = strbuf_new_nm();
  *(strbuf **)((long)__s + 0x128) = psVar1;
  return (ProxyNegotiator *)((long)__s + 0x148);
}

Assistant:

static ProxyNegotiator *proxy_socks5_new(const ProxyNegotiatorVT *vt)
{
    Socks5ProxyNegotiator *s = snew(Socks5ProxyNegotiator);
    memset(s, 0, sizeof(*s));
    s->pn.vt = vt;
    s->auth_methods_offered = strbuf_new();
    s->username = strbuf_new();
    s->password = strbuf_new_nm();
    return &s->pn;
}